

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_condition.cpp
# Opt level: O2

int main(void)

{
  _Head_base<0UL,_tf::Node_*,_false> _Var1;
  FlowBuilder FVar2;
  uint uVar3;
  Executor *this;
  Task C;
  Task B;
  Task A;
  Task D;
  Taskflow taskflow;
  Executor executor;
  string local_270;
  allocator<char> local_249;
  _Head_base<0UL,_tf::Node_*,_false> local_248;
  _Head_base<0UL,_tf::Node_*,_false> local_240;
  _Head_base<0UL,_tf::Node_*,_false> local_238;
  _Head_base<0UL,_tf::Node_*,_false> local_230;
  shared_ptr<tf::WorkerInterface> local_228;
  Taskflow local_210;
  Executor local_148;
  
  uVar3 = std::thread::hardware_concurrency();
  local_228.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_228.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&local_148,(ulong)uVar3,&local_228);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_228.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"Multi-Conditional Tasking Demo",(allocator<char> *)&local_238);
  tf::Taskflow::Taskflow(&local_210,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  FVar2._graph = local_210.super_FlowBuilder._graph;
  local_270._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_270._M_dataplus._M_p[0] = '\0';
  local_270._M_dataplus._M_p[1] = '\0';
  local_270._M_dataplus._M_p[2] = '\0';
  local_270._M_dataplus._M_p[3] = '\0';
  local_270._M_dataplus._M_p[4] = '\0';
  local_270._M_dataplus._M_p[5] = '\0';
  local_270._M_dataplus._M_p[6] = '\0';
  local_270._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_270._M_dataplus._M_p + 8) = local_270._M_dataplus._M_p + 0x18;
  local_270._M_dataplus._M_p[0x10] = '\0';
  local_270._M_dataplus._M_p[0x11] = '\0';
  local_270._M_dataplus._M_p[0x12] = '\0';
  local_270._M_dataplus._M_p[0x13] = '\0';
  local_270._M_dataplus._M_p[0x14] = '\0';
  local_270._M_dataplus._M_p[0x15] = '\0';
  local_270._M_dataplus._M_p[0x16] = '\0';
  local_270._M_dataplus._M_p[0x17] = '\0';
  local_270._M_dataplus._M_p[0x18] = '\0';
  local_270._M_dataplus._M_p[0x28] = '\0';
  local_270._M_dataplus._M_p[0x29] = '\0';
  local_270._M_dataplus._M_p[0x2a] = '\0';
  local_270._M_dataplus._M_p[0x2b] = '\0';
  local_270._M_dataplus._M_p[0x2c] = '\0';
  local_270._M_dataplus._M_p[0x2d] = '\0';
  local_270._M_dataplus._M_p[0x2e] = '\0';
  local_270._M_dataplus._M_p[0x2f] = '\0';
  local_270._M_dataplus._M_p[0x30] = '\0';
  local_270._M_dataplus._M_p[0x31] = '\0';
  local_270._M_dataplus._M_p[0x32] = '\0';
  local_270._M_dataplus._M_p[0x33] = '\0';
  local_270._M_dataplus._M_p[0x34] = '\0';
  local_270._M_dataplus._M_p[0x35] = '\0';
  local_270._M_dataplus._M_p[0x36] = '\0';
  local_270._M_dataplus._M_p[0x37] = '\0';
  local_270._M_dataplus._M_p[0x38] = '\0';
  local_270._M_dataplus._M_p[0x39] = '\0';
  local_270._M_dataplus._M_p[0x3a] = '\0';
  local_270._M_dataplus._M_p[0x3b] = '\0';
  local_270._M_dataplus._M_p[0x3c] = '\0';
  local_270._M_dataplus._M_p[0x3d] = '\0';
  local_270._M_dataplus._M_p[0x3e] = '\0';
  local_270._M_dataplus._M_p[0x3f] = '\0';
  local_270._M_dataplus._M_p[0x40] = '\0';
  local_270._M_dataplus._M_p[0x41] = '\0';
  local_270._M_dataplus._M_p[0x42] = '\0';
  local_270._M_dataplus._M_p[0x43] = '\0';
  local_270._M_dataplus._M_p[0x44] = '\0';
  local_270._M_dataplus._M_p[0x45] = '\0';
  local_270._M_dataplus._M_p[0x46] = '\0';
  local_270._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_270._M_dataplus._M_p + 0x48) = local_270._M_dataplus._M_p + 0x60;
  *(pointer *)(local_270._M_dataplus._M_p + 0x50) = local_270._M_dataplus._M_p + 0x60;
  *(pointer *)(local_270._M_dataplus._M_p + 0x58) = local_270._M_dataplus._M_p + 0x80;
  local_270._M_dataplus._M_p[0x80] = '\0';
  local_270._M_dataplus._M_p[0x81] = '\0';
  local_270._M_dataplus._M_p[0x82] = '\0';
  local_270._M_dataplus._M_p[0x83] = '\0';
  local_270._M_dataplus._M_p[0x84] = '\0';
  local_270._M_dataplus._M_p[0x85] = '\0';
  local_270._M_dataplus._M_p[0x86] = '\0';
  local_270._M_dataplus._M_p[0x87] = '\0';
  local_270._M_dataplus._M_p[0x88] = '\0';
  local_270._M_dataplus._M_p[0x89] = '\0';
  local_270._M_dataplus._M_p[0x8a] = '\0';
  local_270._M_dataplus._M_p[0x8b] = '\0';
  local_270._M_dataplus._M_p[0x8c] = '\0';
  local_270._M_dataplus._M_p[0x8d] = '\0';
  local_270._M_dataplus._M_p[0x8e] = '\0';
  local_270._M_dataplus._M_p[0x8f] = '\0';
  local_270._M_dataplus._M_p[0x90] = '\0';
  local_270._M_dataplus._M_p[0x91] = '\0';
  local_270._M_dataplus._M_p[0x92] = '\0';
  local_270._M_dataplus._M_p[0x93] = '\0';
  local_270._M_dataplus._M_p[0x94] = '\0';
  local_270._M_dataplus._M_p[0x95] = '\0';
  local_270._M_dataplus._M_p[0x96] = '\0';
  local_270._M_dataplus._M_p[0x97] = '\0';
  *(code **)(local_270._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<tf::SmallVector<int,_2U>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/multi_condition.cpp:17:29)>
       ::_M_invoke;
  *(code **)(local_270._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<tf::SmallVector<int,_2U>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/multi_condition.cpp:17:29)>
       ::_M_manager;
  local_270._M_dataplus._M_p[0xc0] = '\x05';
  local_270._M_dataplus._M_p[200] = '\0';
  local_270._M_dataplus._M_p[0xc9] = '\0';
  local_270._M_dataplus._M_p[0xca] = '\0';
  local_270._M_dataplus._M_p[0xcb] = '\0';
  local_270._M_dataplus._M_p[0xcc] = '\0';
  local_270._M_dataplus._M_p[0xcd] = '\0';
  local_270._M_dataplus._M_p[0xce] = '\0';
  local_270._M_dataplus._M_p[0xcf] = '\0';
  local_270._M_dataplus._M_p[0xd0] = '\0';
  local_270._M_dataplus._M_p[0xd1] = '\0';
  local_270._M_dataplus._M_p[0xd2] = '\0';
  local_270._M_dataplus._M_p[0xd3] = '\0';
  local_270._M_dataplus._M_p[0xd4] = '\0';
  local_270._M_dataplus._M_p[0xd5] = '\0';
  local_270._M_dataplus._M_p[0xd6] = '\0';
  local_270._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_270);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_270);
  _Var1._M_head_impl =
       ((FVar2._graph)->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"A",(allocator<char> *)&local_240);
  std::__cxx11::string::_M_assign((string *)&(_Var1._M_head_impl)->_name);
  local_238._M_head_impl = _Var1._M_head_impl;
  std::__cxx11::string::~string((string *)&local_270);
  FVar2._graph = local_210.super_FlowBuilder._graph;
  local_270._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_270._M_dataplus._M_p[0] = '\0';
  local_270._M_dataplus._M_p[1] = '\0';
  local_270._M_dataplus._M_p[2] = '\0';
  local_270._M_dataplus._M_p[3] = '\0';
  local_270._M_dataplus._M_p[4] = '\0';
  local_270._M_dataplus._M_p[5] = '\0';
  local_270._M_dataplus._M_p[6] = '\0';
  local_270._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_270._M_dataplus._M_p + 8) = local_270._M_dataplus._M_p + 0x18;
  local_270._M_dataplus._M_p[0x10] = '\0';
  local_270._M_dataplus._M_p[0x11] = '\0';
  local_270._M_dataplus._M_p[0x12] = '\0';
  local_270._M_dataplus._M_p[0x13] = '\0';
  local_270._M_dataplus._M_p[0x14] = '\0';
  local_270._M_dataplus._M_p[0x15] = '\0';
  local_270._M_dataplus._M_p[0x16] = '\0';
  local_270._M_dataplus._M_p[0x17] = '\0';
  local_270._M_dataplus._M_p[0x18] = '\0';
  local_270._M_dataplus._M_p[0x28] = '\0';
  local_270._M_dataplus._M_p[0x29] = '\0';
  local_270._M_dataplus._M_p[0x2a] = '\0';
  local_270._M_dataplus._M_p[0x2b] = '\0';
  local_270._M_dataplus._M_p[0x2c] = '\0';
  local_270._M_dataplus._M_p[0x2d] = '\0';
  local_270._M_dataplus._M_p[0x2e] = '\0';
  local_270._M_dataplus._M_p[0x2f] = '\0';
  local_270._M_dataplus._M_p[0x30] = '\0';
  local_270._M_dataplus._M_p[0x31] = '\0';
  local_270._M_dataplus._M_p[0x32] = '\0';
  local_270._M_dataplus._M_p[0x33] = '\0';
  local_270._M_dataplus._M_p[0x34] = '\0';
  local_270._M_dataplus._M_p[0x35] = '\0';
  local_270._M_dataplus._M_p[0x36] = '\0';
  local_270._M_dataplus._M_p[0x37] = '\0';
  local_270._M_dataplus._M_p[0x38] = '\0';
  local_270._M_dataplus._M_p[0x39] = '\0';
  local_270._M_dataplus._M_p[0x3a] = '\0';
  local_270._M_dataplus._M_p[0x3b] = '\0';
  local_270._M_dataplus._M_p[0x3c] = '\0';
  local_270._M_dataplus._M_p[0x3d] = '\0';
  local_270._M_dataplus._M_p[0x3e] = '\0';
  local_270._M_dataplus._M_p[0x3f] = '\0';
  local_270._M_dataplus._M_p[0x40] = '\0';
  local_270._M_dataplus._M_p[0x41] = '\0';
  local_270._M_dataplus._M_p[0x42] = '\0';
  local_270._M_dataplus._M_p[0x43] = '\0';
  local_270._M_dataplus._M_p[0x44] = '\0';
  local_270._M_dataplus._M_p[0x45] = '\0';
  local_270._M_dataplus._M_p[0x46] = '\0';
  local_270._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_270._M_dataplus._M_p + 0x48) = local_270._M_dataplus._M_p + 0x60;
  *(pointer *)(local_270._M_dataplus._M_p + 0x50) = local_270._M_dataplus._M_p + 0x60;
  *(pointer *)(local_270._M_dataplus._M_p + 0x58) = local_270._M_dataplus._M_p + 0x80;
  local_270._M_dataplus._M_p[0x80] = '\0';
  local_270._M_dataplus._M_p[0x81] = '\0';
  local_270._M_dataplus._M_p[0x82] = '\0';
  local_270._M_dataplus._M_p[0x83] = '\0';
  local_270._M_dataplus._M_p[0x84] = '\0';
  local_270._M_dataplus._M_p[0x85] = '\0';
  local_270._M_dataplus._M_p[0x86] = '\0';
  local_270._M_dataplus._M_p[0x87] = '\0';
  local_270._M_dataplus._M_p[0x88] = '\0';
  local_270._M_dataplus._M_p[0x89] = '\0';
  local_270._M_dataplus._M_p[0x8a] = '\0';
  local_270._M_dataplus._M_p[0x8b] = '\0';
  local_270._M_dataplus._M_p[0x8c] = '\0';
  local_270._M_dataplus._M_p[0x8d] = '\0';
  local_270._M_dataplus._M_p[0x8e] = '\0';
  local_270._M_dataplus._M_p[0x8f] = '\0';
  local_270._M_dataplus._M_p[0x90] = '\0';
  local_270._M_dataplus._M_p[0x91] = '\0';
  local_270._M_dataplus._M_p[0x92] = '\0';
  local_270._M_dataplus._M_p[0x93] = '\0';
  local_270._M_dataplus._M_p[0x94] = '\0';
  local_270._M_dataplus._M_p[0x95] = '\0';
  local_270._M_dataplus._M_p[0x96] = '\0';
  local_270._M_dataplus._M_p[0x97] = '\0';
  *(code **)(local_270._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/multi_condition.cpp:21:29)>
       ::_M_invoke;
  *(code **)(local_270._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/multi_condition.cpp:21:29)>
       ::_M_manager;
  local_270._M_dataplus._M_p[0xc0] = '\x01';
  local_270._M_dataplus._M_p[200] = '\0';
  local_270._M_dataplus._M_p[0xc9] = '\0';
  local_270._M_dataplus._M_p[0xca] = '\0';
  local_270._M_dataplus._M_p[0xcb] = '\0';
  local_270._M_dataplus._M_p[0xcc] = '\0';
  local_270._M_dataplus._M_p[0xcd] = '\0';
  local_270._M_dataplus._M_p[0xce] = '\0';
  local_270._M_dataplus._M_p[0xcf] = '\0';
  local_270._M_dataplus._M_p[0xd0] = '\0';
  local_270._M_dataplus._M_p[0xd1] = '\0';
  local_270._M_dataplus._M_p[0xd2] = '\0';
  local_270._M_dataplus._M_p[0xd3] = '\0';
  local_270._M_dataplus._M_p[0xd4] = '\0';
  local_270._M_dataplus._M_p[0xd5] = '\0';
  local_270._M_dataplus._M_p[0xd6] = '\0';
  local_270._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_270);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_270);
  _Var1._M_head_impl =
       ((FVar2._graph)->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"B",(allocator<char> *)&local_248);
  std::__cxx11::string::_M_assign((string *)&(_Var1._M_head_impl)->_name);
  local_240._M_head_impl = _Var1._M_head_impl;
  std::__cxx11::string::~string((string *)&local_270);
  FVar2._graph = local_210.super_FlowBuilder._graph;
  local_270._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_270._M_dataplus._M_p[0] = '\0';
  local_270._M_dataplus._M_p[1] = '\0';
  local_270._M_dataplus._M_p[2] = '\0';
  local_270._M_dataplus._M_p[3] = '\0';
  local_270._M_dataplus._M_p[4] = '\0';
  local_270._M_dataplus._M_p[5] = '\0';
  local_270._M_dataplus._M_p[6] = '\0';
  local_270._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_270._M_dataplus._M_p + 8) = local_270._M_dataplus._M_p + 0x18;
  local_270._M_dataplus._M_p[0x10] = '\0';
  local_270._M_dataplus._M_p[0x11] = '\0';
  local_270._M_dataplus._M_p[0x12] = '\0';
  local_270._M_dataplus._M_p[0x13] = '\0';
  local_270._M_dataplus._M_p[0x14] = '\0';
  local_270._M_dataplus._M_p[0x15] = '\0';
  local_270._M_dataplus._M_p[0x16] = '\0';
  local_270._M_dataplus._M_p[0x17] = '\0';
  local_270._M_dataplus._M_p[0x18] = '\0';
  local_270._M_dataplus._M_p[0x28] = '\0';
  local_270._M_dataplus._M_p[0x29] = '\0';
  local_270._M_dataplus._M_p[0x2a] = '\0';
  local_270._M_dataplus._M_p[0x2b] = '\0';
  local_270._M_dataplus._M_p[0x2c] = '\0';
  local_270._M_dataplus._M_p[0x2d] = '\0';
  local_270._M_dataplus._M_p[0x2e] = '\0';
  local_270._M_dataplus._M_p[0x2f] = '\0';
  local_270._M_dataplus._M_p[0x30] = '\0';
  local_270._M_dataplus._M_p[0x31] = '\0';
  local_270._M_dataplus._M_p[0x32] = '\0';
  local_270._M_dataplus._M_p[0x33] = '\0';
  local_270._M_dataplus._M_p[0x34] = '\0';
  local_270._M_dataplus._M_p[0x35] = '\0';
  local_270._M_dataplus._M_p[0x36] = '\0';
  local_270._M_dataplus._M_p[0x37] = '\0';
  local_270._M_dataplus._M_p[0x38] = '\0';
  local_270._M_dataplus._M_p[0x39] = '\0';
  local_270._M_dataplus._M_p[0x3a] = '\0';
  local_270._M_dataplus._M_p[0x3b] = '\0';
  local_270._M_dataplus._M_p[0x3c] = '\0';
  local_270._M_dataplus._M_p[0x3d] = '\0';
  local_270._M_dataplus._M_p[0x3e] = '\0';
  local_270._M_dataplus._M_p[0x3f] = '\0';
  local_270._M_dataplus._M_p[0x40] = '\0';
  local_270._M_dataplus._M_p[0x41] = '\0';
  local_270._M_dataplus._M_p[0x42] = '\0';
  local_270._M_dataplus._M_p[0x43] = '\0';
  local_270._M_dataplus._M_p[0x44] = '\0';
  local_270._M_dataplus._M_p[0x45] = '\0';
  local_270._M_dataplus._M_p[0x46] = '\0';
  local_270._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_270._M_dataplus._M_p + 0x48) = local_270._M_dataplus._M_p + 0x60;
  *(pointer *)(local_270._M_dataplus._M_p + 0x50) = local_270._M_dataplus._M_p + 0x60;
  *(pointer *)(local_270._M_dataplus._M_p + 0x58) = local_270._M_dataplus._M_p + 0x80;
  local_270._M_dataplus._M_p[0x80] = '\0';
  local_270._M_dataplus._M_p[0x81] = '\0';
  local_270._M_dataplus._M_p[0x82] = '\0';
  local_270._M_dataplus._M_p[0x83] = '\0';
  local_270._M_dataplus._M_p[0x84] = '\0';
  local_270._M_dataplus._M_p[0x85] = '\0';
  local_270._M_dataplus._M_p[0x86] = '\0';
  local_270._M_dataplus._M_p[0x87] = '\0';
  local_270._M_dataplus._M_p[0x88] = '\0';
  local_270._M_dataplus._M_p[0x89] = '\0';
  local_270._M_dataplus._M_p[0x8a] = '\0';
  local_270._M_dataplus._M_p[0x8b] = '\0';
  local_270._M_dataplus._M_p[0x8c] = '\0';
  local_270._M_dataplus._M_p[0x8d] = '\0';
  local_270._M_dataplus._M_p[0x8e] = '\0';
  local_270._M_dataplus._M_p[0x8f] = '\0';
  local_270._M_dataplus._M_p[0x90] = '\0';
  local_270._M_dataplus._M_p[0x91] = '\0';
  local_270._M_dataplus._M_p[0x92] = '\0';
  local_270._M_dataplus._M_p[0x93] = '\0';
  local_270._M_dataplus._M_p[0x94] = '\0';
  local_270._M_dataplus._M_p[0x95] = '\0';
  local_270._M_dataplus._M_p[0x96] = '\0';
  local_270._M_dataplus._M_p[0x97] = '\0';
  *(code **)(local_270._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/multi_condition.cpp:22:29)>
       ::_M_invoke;
  *(code **)(local_270._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/multi_condition.cpp:22:29)>
       ::_M_manager;
  local_270._M_dataplus._M_p[0xc0] = '\x01';
  local_270._M_dataplus._M_p[200] = '\0';
  local_270._M_dataplus._M_p[0xc9] = '\0';
  local_270._M_dataplus._M_p[0xca] = '\0';
  local_270._M_dataplus._M_p[0xcb] = '\0';
  local_270._M_dataplus._M_p[0xcc] = '\0';
  local_270._M_dataplus._M_p[0xcd] = '\0';
  local_270._M_dataplus._M_p[0xce] = '\0';
  local_270._M_dataplus._M_p[0xcf] = '\0';
  local_270._M_dataplus._M_p[0xd0] = '\0';
  local_270._M_dataplus._M_p[0xd1] = '\0';
  local_270._M_dataplus._M_p[0xd2] = '\0';
  local_270._M_dataplus._M_p[0xd3] = '\0';
  local_270._M_dataplus._M_p[0xd4] = '\0';
  local_270._M_dataplus._M_p[0xd5] = '\0';
  local_270._M_dataplus._M_p[0xd6] = '\0';
  local_270._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_270);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_270);
  _Var1._M_head_impl =
       ((FVar2._graph)->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"C",(allocator<char> *)&local_230);
  std::__cxx11::string::_M_assign((string *)&(_Var1._M_head_impl)->_name);
  local_248._M_head_impl = _Var1._M_head_impl;
  std::__cxx11::string::~string((string *)&local_270);
  local_270._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_270._M_dataplus._M_p[0] = '\0';
  local_270._M_dataplus._M_p[1] = '\0';
  local_270._M_dataplus._M_p[2] = '\0';
  local_270._M_dataplus._M_p[3] = '\0';
  local_270._M_dataplus._M_p[4] = '\0';
  local_270._M_dataplus._M_p[5] = '\0';
  local_270._M_dataplus._M_p[6] = '\0';
  local_270._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_270._M_dataplus._M_p + 8) = local_270._M_dataplus._M_p + 0x18;
  local_270._M_dataplus._M_p[0x10] = '\0';
  local_270._M_dataplus._M_p[0x11] = '\0';
  local_270._M_dataplus._M_p[0x12] = '\0';
  local_270._M_dataplus._M_p[0x13] = '\0';
  local_270._M_dataplus._M_p[0x14] = '\0';
  local_270._M_dataplus._M_p[0x15] = '\0';
  local_270._M_dataplus._M_p[0x16] = '\0';
  local_270._M_dataplus._M_p[0x17] = '\0';
  local_270._M_dataplus._M_p[0x18] = '\0';
  local_270._M_dataplus._M_p[0x28] = '\0';
  local_270._M_dataplus._M_p[0x29] = '\0';
  local_270._M_dataplus._M_p[0x2a] = '\0';
  local_270._M_dataplus._M_p[0x2b] = '\0';
  local_270._M_dataplus._M_p[0x2c] = '\0';
  local_270._M_dataplus._M_p[0x2d] = '\0';
  local_270._M_dataplus._M_p[0x2e] = '\0';
  local_270._M_dataplus._M_p[0x2f] = '\0';
  local_270._M_dataplus._M_p[0x30] = '\0';
  local_270._M_dataplus._M_p[0x31] = '\0';
  local_270._M_dataplus._M_p[0x32] = '\0';
  local_270._M_dataplus._M_p[0x33] = '\0';
  local_270._M_dataplus._M_p[0x34] = '\0';
  local_270._M_dataplus._M_p[0x35] = '\0';
  local_270._M_dataplus._M_p[0x36] = '\0';
  local_270._M_dataplus._M_p[0x37] = '\0';
  local_270._M_dataplus._M_p[0x38] = '\0';
  local_270._M_dataplus._M_p[0x39] = '\0';
  local_270._M_dataplus._M_p[0x3a] = '\0';
  local_270._M_dataplus._M_p[0x3b] = '\0';
  local_270._M_dataplus._M_p[0x3c] = '\0';
  local_270._M_dataplus._M_p[0x3d] = '\0';
  local_270._M_dataplus._M_p[0x3e] = '\0';
  local_270._M_dataplus._M_p[0x3f] = '\0';
  local_270._M_dataplus._M_p[0x40] = '\0';
  local_270._M_dataplus._M_p[0x41] = '\0';
  local_270._M_dataplus._M_p[0x42] = '\0';
  local_270._M_dataplus._M_p[0x43] = '\0';
  local_270._M_dataplus._M_p[0x44] = '\0';
  local_270._M_dataplus._M_p[0x45] = '\0';
  local_270._M_dataplus._M_p[0x46] = '\0';
  local_270._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_270._M_dataplus._M_p + 0x48) = local_270._M_dataplus._M_p + 0x60;
  *(pointer *)(local_270._M_dataplus._M_p + 0x50) = local_270._M_dataplus._M_p + 0x60;
  *(pointer *)(local_270._M_dataplus._M_p + 0x58) = local_270._M_dataplus._M_p + 0x80;
  local_270._M_dataplus._M_p[0x80] = '\0';
  local_270._M_dataplus._M_p[0x81] = '\0';
  local_270._M_dataplus._M_p[0x82] = '\0';
  local_270._M_dataplus._M_p[0x83] = '\0';
  local_270._M_dataplus._M_p[0x84] = '\0';
  local_270._M_dataplus._M_p[0x85] = '\0';
  local_270._M_dataplus._M_p[0x86] = '\0';
  local_270._M_dataplus._M_p[0x87] = '\0';
  local_270._M_dataplus._M_p[0x88] = '\0';
  local_270._M_dataplus._M_p[0x89] = '\0';
  local_270._M_dataplus._M_p[0x8a] = '\0';
  local_270._M_dataplus._M_p[0x8b] = '\0';
  local_270._M_dataplus._M_p[0x8c] = '\0';
  local_270._M_dataplus._M_p[0x8d] = '\0';
  local_270._M_dataplus._M_p[0x8e] = '\0';
  local_270._M_dataplus._M_p[0x8f] = '\0';
  local_270._M_dataplus._M_p[0x90] = '\0';
  local_270._M_dataplus._M_p[0x91] = '\0';
  local_270._M_dataplus._M_p[0x92] = '\0';
  local_270._M_dataplus._M_p[0x93] = '\0';
  local_270._M_dataplus._M_p[0x94] = '\0';
  local_270._M_dataplus._M_p[0x95] = '\0';
  local_270._M_dataplus._M_p[0x96] = '\0';
  local_270._M_dataplus._M_p[0x97] = '\0';
  *(code **)(local_270._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/multi_condition.cpp:23:29)>
       ::_M_invoke;
  *(code **)(local_270._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/multi_condition.cpp:23:29)>
       ::_M_manager;
  local_270._M_dataplus._M_p[0xc0] = '\x01';
  local_270._M_dataplus._M_p[200] = '\0';
  local_270._M_dataplus._M_p[0xc9] = '\0';
  local_270._M_dataplus._M_p[0xca] = '\0';
  local_270._M_dataplus._M_p[0xcb] = '\0';
  local_270._M_dataplus._M_p[0xcc] = '\0';
  local_270._M_dataplus._M_p[0xcd] = '\0';
  local_270._M_dataplus._M_p[0xce] = '\0';
  local_270._M_dataplus._M_p[0xcf] = '\0';
  local_270._M_dataplus._M_p[0xd0] = '\0';
  local_270._M_dataplus._M_p[0xd1] = '\0';
  local_270._M_dataplus._M_p[0xd2] = '\0';
  local_270._M_dataplus._M_p[0xd3] = '\0';
  local_270._M_dataplus._M_p[0xd4] = '\0';
  local_270._M_dataplus._M_p[0xd5] = '\0';
  local_270._M_dataplus._M_p[0xd6] = '\0';
  local_270._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)local_210.super_FlowBuilder._graph,
             (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_270);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_270);
  _Var1._M_head_impl =
       ((local_210.super_FlowBuilder._graph)->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"D",&local_249);
  std::__cxx11::string::_M_assign((string *)&(_Var1._M_head_impl)->_name);
  local_230._M_head_impl = _Var1._M_head_impl;
  std::__cxx11::string::~string((string *)&local_270);
  tf::Task::precede<tf::Task&,tf::Task&,tf::Task&>
            ((Task *)&local_238,(Task *)&local_240,(Task *)&local_248,(Task *)&local_230);
  tf::Taskflow::dump(&local_210,(ostream *)&std::cout);
  this = &local_148;
  tf::Executor::run((Future<void> *)&local_270,this,&local_210);
  std::__basic_future<void>::wait((__basic_future<void> *)&local_270,this);
  tf::Future<void>::~Future((Future<void> *)&local_270);
  tf::Taskflow::~Taskflow(&local_210);
  tf::Executor::~Executor(&local_148);
  return 0;
}

Assistant:

int main() {

  tf::Executor executor;
  tf::Taskflow taskflow("Multi-Conditional Tasking Demo");

  auto A = taskflow.emplace([&]() -> tf::SmallVector<int> {
    std::cout << "A\n";
    return {0, 2};
  }).name("A");
  auto B = taskflow.emplace([&](){ std::cout << "B\n"; }).name("B");
  auto C = taskflow.emplace([&](){ std::cout << "C\n"; }).name("C");
  auto D = taskflow.emplace([&](){ std::cout << "D\n"; }).name("D");

  A.precede(B, C, D);

  // visualizes the taskflow
  taskflow.dump(std::cout);

  // executes the taskflow
  executor.run(taskflow).wait();

  return 0;
}